

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O0

void ab_partitions_search
               (AV1_COMP *cpi,ThreadData_conflict *td,TileDataEnc *tile_data,TokenExtra **tp,
               MACROBLOCK *x,RD_SEARCH_MACROBLOCK_CONTEXT *x_ctx,PC_TREE *pc_tree,
               PartitionSearchState *part_search_state,RD_STATS *best_rdc,
               RD_RECT_PART_WIN_INFO *rect_part_win_info,int pb_source_variance,
               int ext_partition_allowed,AB_PART_TYPE start_type,AB_PART_TYPE end_type)

{
  BLOCK_SIZE BVar1;
  BLOCK_SIZE BVar2;
  BLOCK_SIZE BVar3;
  BLOCK_SIZE BVar4;
  PICK_MODE_CONTEXT *pPVar5;
  PC_TREE_SHARED_BUFFERS *unaff_RBX;
  long in_RDI;
  long in_R8;
  undefined8 unaff_R12;
  AV1_COMP *unaff_R13;
  PICK_MODE_CONTEXT *in_stack_00000008;
  PICK_MODE_CONTEXT *in_stack_00000010;
  MB_MODE_INFO **in_stack_00000018;
  int in_stack_00000030;
  byte in_stack_00000038;
  MB_MODE_INFO *mode_cache [3];
  int i;
  PARTITION_TYPE part_type;
  AB_PART_TYPE ab_part_type;
  int ab_mi_pos [4] [3] [2];
  BLOCK_SIZE ab_subsize [4] [3];
  PICK_MODE_CONTEXT **mode_srch_ctx [4] [2];
  PICK_MODE_CONTEXT **cur_part_ctxs [4];
  int is_ctx_ready [4] [2];
  int ab_partitions_allowed [4];
  BLOCK_SIZE bsize;
  int mi_col;
  int mi_row;
  PartitionBlkParams blk_params;
  undefined8 in_stack_fffffffffffffe08;
  PICK_MODE_CONTEXT *src_ctx;
  PICK_MODE_CONTEXT *dst_ctx;
  AB_PART_TYPE ab_part_type_00;
  PICK_MODE_CONTEXT *pc_tree_00;
  MB_MODE_INFO **in_stack_fffffffffffffe20;
  undefined1 local_1b8 [24];
  int local_1a0;
  PARTITION_TYPE local_19a;
  byte local_199;
  int32_t local_198;
  int32_t local_194;
  int32_t local_190;
  int16_t local_18c;
  int16_t iStack_18a;
  int32_t local_188;
  int32_t local_184;
  int32_t local_180;
  int32_t local_17c;
  int32_t local_178;
  int32_t local_174;
  int32_t local_170;
  int16_t local_16c;
  int16_t iStack_16a;
  int32_t local_168;
  int32_t local_164;
  int32_t local_160;
  int32_t local_15c;
  int32_t local_158;
  int16_t local_154;
  int16_t iStack_152;
  int32_t local_150;
  undefined4 in_stack_fffffffffffffeb4;
  undefined4 in_stack_fffffffffffffeb8;
  int32_t iVar6;
  undefined4 in_stack_fffffffffffffebc;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffffec0;
  int32_t iVar8;
  undefined4 in_stack_fffffffffffffec4;
  undefined4 uVar9;
  undefined4 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffecc;
  undefined1 uVar10;
  undefined1 in_stack_fffffffffffffecd;
  undefined1 uVar11;
  undefined1 in_stack_fffffffffffffece;
  undefined1 in_stack_fffffffffffffecf;
  undefined1 in_stack_fffffffffffffed0;
  undefined1 uVar12;
  undefined1 in_stack_fffffffffffffed1;
  undefined1 uVar13;
  undefined1 in_stack_fffffffffffffed2;
  undefined1 uVar14;
  undefined1 in_stack_fffffffffffffed3;
  undefined1 uVar15;
  undefined1 in_stack_fffffffffffffed4;
  undefined1 in_stack_fffffffffffffed5;
  undefined1 in_stack_fffffffffffffed6;
  undefined1 uVar16;
  undefined1 in_stack_fffffffffffffed7;
  undefined1 uVar17;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  AV1_COMP *in_stack_fffffffffffffee0;
  PartitionSearchState *in_stack_fffffffffffffef8;
  int *in_stack_ffffffffffffff00;
  PICK_MODE_CONTEXT **local_e8;
  PC_TREE *pc_tree_01;
  PICK_MODE_CONTEXT **dst_ctxs;
  PartitionSearchState *part_search_state_00;
  int iVar18;
  int iVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  MB_MODE_INFO **in_stack_ffffffffffffff58;
  int32_t local_80;
  int32_t local_7c;
  int32_t local_78;
  int16_t local_74;
  int16_t iStack_72;
  BLOCK_SIZE local_5b;
  undefined1 local_5a;
  long local_50;
  long local_30;
  
  uVar10 = (undefined1)((uint)in_stack_fffffffffffffeb4 >> 0x18);
  uVar20 = (undefined4)((ulong)in_stack_fffffffffffffe08 >> 0x20);
  local_50 = in_R8;
  local_30 = in_RDI;
  memcpy(&stack0xffffffffffffff7c,(in_stack_00000010->mic).mv,0x2c);
  if (*(int *)&in_stack_00000010->blk_skip == 0) {
    pc_tree_00 = (PICK_MODE_CONTEXT *)&stack0xffffffffffffff58;
    src_ctx = (PICK_MODE_CONTEXT *)CONCAT44(uVar20,(uint)(in_stack_00000030 != 0));
    dst_ctx = in_stack_00000010;
    av1_prune_ab_partitions
              (in_stack_fffffffffffffee0,
               (MACROBLOCK *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
               (PC_TREE *)
               CONCAT17(in_stack_fffffffffffffed7,
                        CONCAT16(in_stack_fffffffffffffed6,
                                 CONCAT15(in_stack_fffffffffffffed5,
                                          CONCAT14(in_stack_fffffffffffffed4,
                                                   CONCAT13(in_stack_fffffffffffffed3,
                                                            CONCAT12(in_stack_fffffffffffffed2,
                                                                     CONCAT11(
                                                  in_stack_fffffffffffffed1,
                                                  in_stack_fffffffffffffed0))))))),
               CONCAT13(in_stack_fffffffffffffecf,
                        CONCAT12(in_stack_fffffffffffffece,
                                 CONCAT11(in_stack_fffffffffffffecd,in_stack_fffffffffffffecc))),
               CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
               (RD_RECT_PART_WIN_INFO *)
               CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),(_Bool)uVar10,
               in_stack_fffffffffffffef8,in_stack_ffffffffffffff00);
    iVar18 = *(int *)in_stack_00000010->color_index_map;
    iVar19 = *(int *)((long)in_stack_00000010->color_index_map + 4);
    uVar20 = *(undefined4 *)(in_stack_00000010->color_index_map + 1);
    uVar21 = 0;
    uVar22 = *(undefined4 *)in_stack_00000010->color_index_map;
    uVar23 = 0;
    uVar24 = *(undefined4 *)((long)in_stack_00000010->color_index_map + 0xc);
    local_e8 = (PICK_MODE_CONTEXT **)((in_stack_00000008->mic).wm_params.wmmat + 5);
    pc_tree_01 = (PC_TREE *)&(in_stack_00000008->mic).interinter_comp;
    dst_ctxs = (PICK_MODE_CONTEXT **)((in_stack_00000008->mic).palette_mode_info.palette_colors + 1)
    ;
    part_search_state_00 =
         (PartitionSearchState *)((in_stack_00000008->mic).palette_mode_info.palette_colors + 0xd);
    set_mode_search_ctx((PC_TREE *)in_stack_00000008,(int (*) [2])&stack0xffffffffffffff38,
                        (PICK_MODE_CONTEXT **(*) [2])&stack0xfffffffffffffed8);
    uVar10 = local_5a;
    uVar11 = local_5a;
    BVar1 = get_partition_subsize
                      ((BLOCK_SIZE)((ulong)dst_ctx >> 0x30),(PARTITION_TYPE)((ulong)dst_ctx >> 0x28)
                      );
    BVar2 = get_partition_subsize
                      ((BLOCK_SIZE)((ulong)dst_ctx >> 0x30),(PARTITION_TYPE)((ulong)dst_ctx >> 0x28)
                      );
    uVar12 = local_5a;
    uVar13 = local_5a;
    uVar14 = local_5a;
    uVar15 = local_5a;
    BVar3 = get_partition_subsize
                      ((BLOCK_SIZE)((ulong)dst_ctx >> 0x30),(PARTITION_TYPE)((ulong)dst_ctx >> 0x28)
                      );
    BVar4 = get_partition_subsize
                      ((BLOCK_SIZE)((ulong)dst_ctx >> 0x30),(PARTITION_TYPE)((ulong)dst_ctx >> 0x28)
                      );
    local_198 = local_80;
    local_194 = local_7c;
    local_190 = local_80;
    local_18c = local_74;
    iStack_18a = iStack_72;
    local_188 = local_78;
    local_184 = local_7c;
    local_180 = local_80;
    local_17c = local_7c;
    local_178 = local_78;
    local_174 = local_7c;
    local_170 = local_78;
    local_16c = local_74;
    iStack_16a = iStack_72;
    local_168 = local_80;
    local_164 = local_7c;
    local_160 = local_78;
    local_15c = local_7c;
    local_158 = local_80;
    local_154 = local_74;
    iStack_152 = iStack_72;
    local_150 = local_80;
    iVar6 = local_80;
    uVar7 = _local_74;
    iVar8 = local_78;
    uVar9 = _local_74;
    uVar16 = local_5a;
    uVar17 = local_5a;
    for (local_199 = in_stack_00000038; local_199 <= (byte)mode_cache[0]; local_199 = local_199 + 1)
    {
      local_19a = local_199 + 4;
      if (*(int *)(&stack0xffffffffffffff58 + (ulong)local_199 * 4) != 0) {
        local_5b = get_partition_subsize
                             ((BLOCK_SIZE)((ulong)dst_ctx >> 0x30),
                              (PARTITION_TYPE)((ulong)dst_ctx >> 0x28));
        for (local_1a0 = 0; local_1a0 < 3; local_1a0 = local_1a0 + 1) {
          pPVar5 = av1_alloc_pmc(unaff_R13,SUB81(unaff_R12,7),unaff_RBX);
          (&local_e8)[local_199][local_1a0] = pPVar5;
          if ((&local_e8)[local_199][local_1a0] == (PICK_MODE_CONTEXT *)0x0) {
            aom_internal_error(*(aom_internal_error_info **)(local_50 + 0x2b90),AOM_CODEC_MEM_ERROR,
                               "Failed to allocate PICK_MODE_CONTEXT");
          }
          (&local_e8)[local_199][local_1a0]->rd_mode_is_ready = 0;
        }
        if ((*(int *)(local_30 + 0x609d4) != 0) &&
           (*(int *)(&stack0xffffffffffffff38 + (ulong)local_199 * 8) != 0)) {
          av1_copy_tree_context(dst_ctx,src_ctx);
          ((*(&local_e8)[local_199])->mic).partition = local_19a;
          (*(&local_e8)[local_199])->rd_mode_is_ready = 1;
          if (*(int *)(&stack0xffffffffffffff3c + (ulong)local_199 * 8) != 0) {
            av1_copy_tree_context(dst_ctx,src_ctx);
            ((&local_e8)[local_199][1]->mic).partition = local_19a;
            (&local_e8)[local_199][1]->rd_mode_is_ready = 1;
          }
        }
        ab_part_type_00 = (AB_PART_TYPE)((ulong)dst_ctx >> 0x38);
        memset(local_1b8,0,0x18);
        if (*(int *)(local_30 + 0x609d8) != 0) {
          set_mode_cache_for_partition_ab
                    (in_stack_fffffffffffffe20,(PC_TREE *)pc_tree_00,ab_part_type_00);
        }
        dst_ctx = (PICK_MODE_CONTEXT *)(&local_e8)[local_199];
        src_ctx = in_stack_00000008;
        pc_tree_00 = in_stack_00000010;
        in_stack_fffffffffffffe20 = in_stack_00000018;
        rd_pick_ab_part(in_stack_fffffffffffffee0,
                        (ThreadData_conflict *)
                        CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                        (TileDataEnc *)
                        CONCAT17(uVar17,CONCAT16(uVar16,CONCAT15(BVar4,CONCAT14(BVar3,CONCAT13(
                                                  uVar15,CONCAT12(uVar14,CONCAT11(uVar13,uVar12)))))
                                                )),
                        (TokenExtra **)
                        CONCAT17(BVar2,CONCAT16(BVar1,CONCAT15(uVar11,CONCAT14(uVar10,
                                                  in_stack_fffffffffffffec8)))),
                        (MACROBLOCK *)CONCAT44(uVar9,iVar8),
                        (RD_SEARCH_MACROBLOCK_CONTEXT *)CONCAT44(uVar7,iVar6),pc_tree_01,dst_ctxs,
                        part_search_state_00,(RD_STATS *)CONCAT44(iVar19,iVar18),
                        (BLOCK_SIZE *)CONCAT44(uVar21,uVar20),(int (*) [2])CONCAT44(uVar23,uVar22),
                        (PARTITION_TYPE)uVar24,in_stack_ffffffffffffff58);
      }
    }
  }
  return;
}

Assistant:

static void ab_partitions_search(
    AV1_COMP *const cpi, ThreadData *td, TileDataEnc *tile_data,
    TokenExtra **tp, MACROBLOCK *x, RD_SEARCH_MACROBLOCK_CONTEXT *x_ctx,
    PC_TREE *pc_tree, PartitionSearchState *part_search_state,
    RD_STATS *best_rdc, RD_RECT_PART_WIN_INFO *rect_part_win_info,
    int pb_source_variance, int ext_partition_allowed,
    const AB_PART_TYPE start_type, const AB_PART_TYPE end_type) {
  PartitionBlkParams blk_params = part_search_state->part_blk_params;
  const int mi_row = blk_params.mi_row;
  const int mi_col = blk_params.mi_col;
  const BLOCK_SIZE bsize = blk_params.bsize;

  if (part_search_state->terminate_partition_search) {
    return;
  }

  int ab_partitions_allowed[NUM_AB_PARTS];
  // Prune AB partitions
  av1_prune_ab_partitions(cpi, x, pc_tree, pb_source_variance, best_rdc->rdcost,
                          rect_part_win_info, ext_partition_allowed,
                          part_search_state, ab_partitions_allowed);

  // Flags to indicate whether the mode search is done.
  const int is_ctx_ready[NUM_AB_PARTS][2] = {
    { part_search_state->is_split_ctx_is_ready[0],
      part_search_state->is_split_ctx_is_ready[1] },
    { part_search_state->is_rect_ctx_is_ready[HORZ], 0 },
    { part_search_state->is_split_ctx_is_ready[0], 0 },
    { part_search_state->is_rect_ctx_is_ready[VERT], 0 }
  };

  // Current partition context.
  PICK_MODE_CONTEXT **cur_part_ctxs[NUM_AB_PARTS] = { pc_tree->horizontala,
                                                      pc_tree->horizontalb,
                                                      pc_tree->verticala,
                                                      pc_tree->verticalb };

  // Context of already evaluted partition types.
  PICK_MODE_CONTEXT **mode_srch_ctx[NUM_AB_PARTS][2];
  // Set context of already evaluted partition types.
  set_mode_search_ctx(pc_tree, is_ctx_ready, mode_srch_ctx);

  // Array of sub-partition size of AB partition types.
  const BLOCK_SIZE ab_subsize[NUM_AB_PARTS][SUB_PARTITIONS_AB] = {
    { blk_params.split_bsize2, blk_params.split_bsize2,
      get_partition_subsize(bsize, PARTITION_HORZ_A) },
    { get_partition_subsize(bsize, PARTITION_HORZ_B), blk_params.split_bsize2,
      blk_params.split_bsize2 },
    { blk_params.split_bsize2, blk_params.split_bsize2,
      get_partition_subsize(bsize, PARTITION_VERT_A) },
    { get_partition_subsize(bsize, PARTITION_VERT_B), blk_params.split_bsize2,
      blk_params.split_bsize2 }
  };

  // Array of mi_row, mi_col positions corresponds to each sub-partition in AB
  // partition types.
  const int ab_mi_pos[NUM_AB_PARTS][SUB_PARTITIONS_AB][2] = {
    { { mi_row, mi_col },
      { mi_row, blk_params.mi_col_edge },
      { blk_params.mi_row_edge, mi_col } },
    { { mi_row, mi_col },
      { blk_params.mi_row_edge, mi_col },
      { blk_params.mi_row_edge, blk_params.mi_col_edge } },
    { { mi_row, mi_col },
      { blk_params.mi_row_edge, mi_col },
      { mi_row, blk_params.mi_col_edge } },
    { { mi_row, mi_col },
      { mi_row, blk_params.mi_col_edge },
      { blk_params.mi_row_edge, blk_params.mi_col_edge } }
  };

  // Loop over AB partition types.
  for (AB_PART_TYPE ab_part_type = start_type; ab_part_type <= end_type;
       ab_part_type++) {
    const PARTITION_TYPE part_type = ab_part_type + PARTITION_HORZ_A;

    // Check if the AB partition search is to be performed.
    if (!ab_partitions_allowed[ab_part_type]) {
      continue;
    }

    blk_params.subsize = get_partition_subsize(bsize, part_type);
    for (int i = 0; i < SUB_PARTITIONS_AB; i++) {
      // Set AB partition context.
      cur_part_ctxs[ab_part_type][i] = av1_alloc_pmc(
          cpi, ab_subsize[ab_part_type][i], &td->shared_coeff_buf);
      if (!cur_part_ctxs[ab_part_type][i])
        aom_internal_error(x->e_mbd.error_info, AOM_CODEC_MEM_ERROR,
                           "Failed to allocate PICK_MODE_CONTEXT");
      // Set mode as not ready.
      cur_part_ctxs[ab_part_type][i]->rd_mode_is_ready = 0;
    }

    if (cpi->sf.part_sf.reuse_prev_rd_results_for_part_ab) {
      // We can copy directly the mode search results if we have already
      // searched the current block and the contexts match.
      if (is_ctx_ready[ab_part_type][0]) {
        av1_copy_tree_context(cur_part_ctxs[ab_part_type][0],
                              mode_srch_ctx[ab_part_type][0][0]);
        cur_part_ctxs[ab_part_type][0]->mic.partition = part_type;
        cur_part_ctxs[ab_part_type][0]->rd_mode_is_ready = 1;
        if (is_ctx_ready[ab_part_type][1]) {
          av1_copy_tree_context(cur_part_ctxs[ab_part_type][1],
                                mode_srch_ctx[ab_part_type][1][0]);
          cur_part_ctxs[ab_part_type][1]->mic.partition = part_type;
          cur_part_ctxs[ab_part_type][1]->rd_mode_is_ready = 1;
        }
      }
    }

    // Even if the contexts don't match, we can still speed up by reusing the
    // previous prediction mode.
    const MB_MODE_INFO *mode_cache[3] = { NULL, NULL, NULL };
    if (cpi->sf.part_sf.reuse_best_prediction_for_part_ab) {
      set_mode_cache_for_partition_ab(mode_cache, pc_tree, ab_part_type);
    }

    // Evaluation of AB partition type.
    rd_pick_ab_part(cpi, td, tile_data, tp, x, x_ctx, pc_tree,
                    cur_part_ctxs[ab_part_type], part_search_state, best_rdc,
                    ab_subsize[ab_part_type], ab_mi_pos[ab_part_type],
                    part_type, mode_cache);
  }
}